

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

size_t bitset_union_count(bitset_t *b1,bitset_t *b2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *in_RSI;
  long *in_RDI;
  size_t k;
  size_t minlength;
  size_t answer;
  ulong local_30;
  ulong local_28;
  size_t local_18;
  
  local_18 = 0;
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    local_30 = in_RDI[1];
  }
  else {
    local_30 = in_RSI[1];
  }
  for (local_28 = 0; local_28 + 3 < local_30; local_28 = local_28 + 4) {
    iVar1 = roaring_hamming(*(ulong *)(*in_RDI + local_28 * 8) | *(ulong *)(*in_RSI + local_28 * 8))
    ;
    iVar2 = roaring_hamming(*(ulong *)(*in_RDI + 8 + local_28 * 8) |
                            *(ulong *)(*in_RSI + 8 + local_28 * 8));
    iVar3 = roaring_hamming(*(ulong *)(*in_RDI + 0x10 + local_28 * 8) |
                            *(ulong *)(*in_RSI + 0x10 + local_28 * 8));
    iVar4 = roaring_hamming(*(ulong *)(*in_RDI + 0x18 + local_28 * 8) |
                            *(ulong *)(*in_RSI + 0x18 + local_28 * 8));
    local_18 = (long)iVar4 + (long)iVar3 + (long)iVar2 + (long)iVar1 + local_18;
  }
  for (; local_28 < local_30; local_28 = local_28 + 1) {
    iVar1 = roaring_hamming(*(ulong *)(*in_RDI + local_28 * 8) | *(ulong *)(*in_RSI + local_28 * 8))
    ;
    local_18 = (long)iVar1 + local_18;
  }
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    for (; local_28 + 3 < (ulong)in_RSI[1]; local_28 = local_28 + 4) {
      iVar1 = roaring_hamming(*(uint64_t *)(*in_RSI + local_28 * 8));
      iVar2 = roaring_hamming(*(uint64_t *)(*in_RSI + 8 + local_28 * 8));
      iVar3 = roaring_hamming(*(uint64_t *)(*in_RSI + 0x10 + local_28 * 8));
      iVar4 = roaring_hamming(*(uint64_t *)(*in_RSI + 0x18 + local_28 * 8));
      local_18 = (long)iVar4 + (long)iVar3 + (long)iVar2 + (long)iVar1 + local_18;
    }
    for (; local_28 < (ulong)in_RSI[1]; local_28 = local_28 + 1) {
      iVar1 = roaring_hamming(*(uint64_t *)(*in_RSI + local_28 * 8));
      local_18 = (long)iVar1 + local_18;
    }
  }
  else {
    for (; local_28 + 3 < (ulong)in_RDI[1]; local_28 = local_28 + 4) {
      iVar1 = roaring_hamming(*(uint64_t *)(*in_RDI + local_28 * 8));
      iVar2 = roaring_hamming(*(uint64_t *)(*in_RDI + 8 + local_28 * 8));
      iVar3 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x10 + local_28 * 8));
      iVar4 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x18 + local_28 * 8));
      local_18 = (long)iVar4 + (long)iVar3 + (long)iVar2 + (long)iVar1 + local_18;
    }
    for (; local_28 < (ulong)in_RDI[1]; local_28 = local_28 + 1) {
      iVar1 = roaring_hamming(*(uint64_t *)(*in_RDI + local_28 * 8));
      local_18 = (long)iVar1 + local_18;
    }
  }
  return local_18;
}

Assistant:

size_t bitset_union_count(const bitset_t *CROARING_CBITSET_RESTRICT b1,
                          const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t answer = 0;
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k + 3 < minlength; k += 4) {
        answer += roaring_hamming(b1->array[k] | b2->array[k]);
        answer += roaring_hamming(b1->array[k + 1] | b2->array[k + 1]);
        answer += roaring_hamming(b1->array[k + 2] | b2->array[k + 2]);
        answer += roaring_hamming(b1->array[k + 3] | b2->array[k + 3]);
    }
    for (; k < minlength; ++k) {
        answer += roaring_hamming(b1->array[k] | b2->array[k]);
    }
    if (b2->arraysize > b1->arraysize) {
        // k is equal to b1->arraysize
        for (; k + 3 < b2->arraysize; k += 4) {
            answer += roaring_hamming(b2->array[k]);
            answer += roaring_hamming(b2->array[k + 1]);
            answer += roaring_hamming(b2->array[k + 2]);
            answer += roaring_hamming(b2->array[k + 3]);
        }
        for (; k < b2->arraysize; ++k) {
            answer += roaring_hamming(b2->array[k]);
        }
    } else {
        // k is equal to b2->arraysize
        for (; k + 3 < b1->arraysize; k += 4) {
            answer += roaring_hamming(b1->array[k]);
            answer += roaring_hamming(b1->array[k + 1]);
            answer += roaring_hamming(b1->array[k + 2]);
            answer += roaring_hamming(b1->array[k + 3]);
        }
        for (; k < b1->arraysize; ++k) {
            answer += roaring_hamming(b1->array[k]);
        }
    }
    return answer;
}